

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O1

void libssh2_exit(void)

{
  if (((_libssh2_initialized != 0) &&
      (_libssh2_initialized = _libssh2_initialized + -1, _libssh2_initialized == 0)) &&
     (((byte)_libssh2_init_flags & 1) == 0)) {
    return;
  }
  return;
}

Assistant:

LIBSSH2_API void
libssh2_exit(void)
{
    if(_libssh2_initialized == 0)
        return;

    _libssh2_initialized--;

    if(_libssh2_initialized == 0 &&
       !(_libssh2_init_flags & LIBSSH2_INIT_NO_CRYPTO)) {
        libssh2_crypto_exit();
    }

    return;
}